

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

void GPU_SetTargetRGBA(GPU_Target *target,Uint8 r,Uint8 g,Uint8 b,Uint8 a)

{
  if (target != (GPU_Target *)0x0) {
    target->use_color = (byte)(b & a & g & r) != 0xff;
    (target->color).r = r;
    (target->color).g = g;
    (target->color).b = b;
    (target->color).a = a;
  }
  return;
}

Assistant:

void GPU_SetTargetRGBA(GPU_Target* target, Uint8 r, Uint8 g, Uint8 b, Uint8 a)
{
    SDL_Color c;
    c.r = r;
    c.g = g;
    c.b = b;
    GET_ALPHA(c) = a;

    if(target == NULL)
        return;

    target->use_color = !(r == 255 && g == 255 && b == 255 && a == 255);
    target->color = c;
}